

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cmd.cpp
# Opt level: O0

void FS_MapCmd(FScanner *sc)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  uint local_24;
  int local_20;
  int flags;
  int NextSkill;
  char nextmap [9];
  FScanner *sc_local;
  
  local_20 = -1;
  local_24 = 0x22;
  nextmap._1_8_ = sc;
  uVar3 = FIntCVar::operator_cast_to_int(&dmflags);
  if ((uVar3 & 0x1000) != 0) {
    local_24 = 0x26;
  }
  FScanner::MustGetString((FScanner *)nextmap._1_8_);
  strncpy((char *)((long)&flags + 3),*(char **)nextmap._1_8_,8);
  nextmap[0] = '\0';
  while (bVar2 = FScanner::GetString((FScanner *)nextmap._1_8_), bVar2) {
    bVar2 = FScanner::Compare((FScanner *)nextmap._1_8_,"-skill");
    if (bVar2) {
      FScanner::MustGetNumber((FScanner *)nextmap._1_8_);
      iVar1 = *(int *)(nextmap._1_8_ + 0x10);
      uVar3 = TArray<FSkillInfo,_FSkillInfo>::Size(&AllSkills);
      local_20 = clamp<int>(iVar1 + -1,0,uVar3 - 1);
    }
    else {
      bVar2 = FScanner::Compare((FScanner *)nextmap._1_8_,"-monsters");
      if (bVar2) {
        FScanner::MustGetNumber((FScanner *)nextmap._1_8_);
        if (*(int *)(nextmap._1_8_ + 0x10) == 0) {
          local_24 = local_24 | 4;
        }
        else {
          local_24 = local_24 & 0xfffffffb;
        }
      }
      else {
        bVar2 = FScanner::Compare((FScanner *)nextmap._1_8_,"-noresetplayers");
        if (bVar2) {
          local_24 = local_24 & 0xffffffdd;
        }
      }
    }
  }
  G_ChangeLevel((char *)((long)&flags + 3),0,local_24,local_20);
  return;
}

Assistant:

void FS_MapCmd(FScanner &sc)
{
	char nextmap[9];
	int NextSkill = -1;
	int flags = CHANGELEVEL_RESETINVENTORY|CHANGELEVEL_RESETHEALTH;
	if (dmflags & DF_NO_MONSTERS)
		flags |= CHANGELEVEL_NOMONSTERS;
	sc.MustGetString();
	strncpy (nextmap, sc.String, 8);
	nextmap[8]=0;

	while (sc.GetString())
	{
		if (sc.Compare("-skill"))
		{
			sc.MustGetNumber();
			NextSkill = clamp<int>(sc.Number-1, 0, AllSkills.Size()-1);
		}
		else if (sc.Compare("-monsters"))
		{
			sc.MustGetNumber();
			if (sc.Number)
				flags &= ~CHANGELEVEL_NOMONSTERS;
			else
				flags |= CHANGELEVEL_NOMONSTERS;
		}
		else if (sc.Compare("-noresetplayers"))
		{
			flags &= ~(CHANGELEVEL_RESETINVENTORY|CHANGELEVEL_RESETHEALTH);
		}
	}
	G_ChangeLevel(nextmap, 0, flags, NextSkill);
}